

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextNewFrameUpdateUndocking(ImGuiContext *ctx)

{
  ImVector<ImGuiWindow_*> *pIVar1;
  ImGuiID *pIVar2;
  ImGuiDockRequest *pIVar3;
  ImGuiDockNode *src_node;
  ImGuiDockNode *pIVar4;
  ImGuiWindow *window;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  ImGuiDockNode *pIVar7;
  long lVar8;
  ImGuiWindow **__dest;
  long lVar9;
  long lVar10;
  ImVec2 IVar11;
  
  if (((ctx->IO).ConfigFlags & 0x40) == 0) {
    if ((0 < (ctx->DockContext).Nodes.Data.Size) || (0 < (ctx->DockContext).Requests.Size)) {
      DockContextClearNodes(ctx,0,true);
      return;
    }
  }
  else {
    if (((ctx->IO).ConfigDockingNoSplit == true) && (0 < (ctx->DockContext).Nodes.Data.Size)) {
      lVar9 = 8;
      lVar10 = 0;
      do {
        pIVar2 = *(ImGuiID **)((long)&((ctx->DockContext).Nodes.Data.Data)->key + lVar9);
        if (((pIVar2 != (ImGuiID *)0x0) && (*(long *)(pIVar2 + 6) == 0)) &&
           (*(long *)(pIVar2 + 8) != 0)) {
          DockBuilderRemoveNodeChildNodes(*pIVar2);
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar10 < (ctx->DockContext).Nodes.Data.Size);
    }
    if ((ctx->DockContext).WantFullRebuild == true) {
      DockContextRebuildNodes(ctx);
      (ctx->DockContext).WantFullRebuild = false;
    }
    if (0 < (ctx->DockContext).Requests.Size) {
      lVar9 = 0;
      do {
        pIVar3 = (ctx->DockContext).Requests.Data;
        if (pIVar3[lVar9].Type == ImGuiDockRequestType_Undock) {
          if ((ImGuiContext *)pIVar3[lVar9].UndockTargetWindow == (ImGuiContext *)0x0) {
            src_node = pIVar3[lVar9].UndockTargetNode;
            if (src_node != (ImGuiDockNode *)0x0) {
              if (src_node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
                __assert_fail("node->IsLeafNode()",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                              ,0x3443,
                              "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                             );
              }
              if ((src_node->Windows).Size < 1) {
                __assert_fail("node->Windows.Size >= 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                              ,0x3444,
                              "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                             );
              }
              pIVar7 = src_node->ParentNode;
              if ((pIVar7 == (ImGuiDockNode *)0x0) || ((src_node->MergedFlags & 0x800) != 0)) {
                pIVar7 = DockContextAddNode(ctx,0);
                pIVar7->Pos = src_node->Pos;
                pIVar7->Size = src_node->Size;
                pIVar7->SizeRef = src_node->SizeRef;
                DockNodeMoveWindows(pIVar7,src_node);
                DockSettingsRenameNodeReferences(src_node->ID,pIVar7->ID);
                if (0 < (pIVar7->Windows).Size) {
                  lVar10 = 0;
                  do {
                    window = (pIVar7->Windows).Data[lVar10];
                    window->Flags = window->Flags & 0xfeffffff;
                    pIVar5 = window->ParentWindow;
                    if (pIVar5 != (ImGuiWindow *)0x0) {
                      ppIVar6 = (pIVar5->DC).ChildWindows.Data;
                      lVar8 = (long)(pIVar5->DC).ChildWindows.Size;
                      __dest = ppIVar6;
                      if (0 < lVar8) {
                        do {
                          if (*__dest == window) break;
                          __dest = __dest + 1;
                        } while (__dest < ppIVar6 + lVar8);
                      }
                      if (__dest < ppIVar6 + lVar8) {
                        if (__dest < ppIVar6) {
                          __assert_fail("it >= Data && it < Data + Size",
                                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                                        ,0x71d,
                                        "T *ImVector<ImGuiWindow *>::erase(const T *) [T = ImGuiWindow *]"
                                       );
                        }
                        memmove(__dest,__dest + 1,
                                (((ulong)~((long)__dest - (long)ppIVar6) >> 3) + lVar8) * 8);
                        pIVar1 = &(pIVar5->DC).ChildWindows;
                        pIVar1->Size = pIVar1->Size + -1;
                      }
                    }
                    UpdateWindowParentAndRootLinks(window,window->Flags,(ImGuiWindow *)0x0);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 < (pIVar7->Windows).Size);
                }
              }
              else {
                pIVar4 = pIVar7->ChildNodes[0];
                if ((pIVar4 != src_node) && (pIVar7->ChildNodes[1] != src_node)) {
                  __assert_fail("node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                                ,0x345c,
                                "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                               );
                }
                pIVar7->ChildNodes[pIVar4 != src_node] = (ImGuiDockNode *)0x0;
                DockNodeTreeMerge(ctx,src_node->ParentNode,
                                  src_node->ParentNode->ChildNodes[pIVar4 == src_node]);
                *(ushort *)&src_node->ParentNode->field_0xbc =
                     (ushort)*(undefined4 *)&src_node->ParentNode->field_0xbc & 0xfe3f | 0x80;
                src_node->ParentNode = (ImGuiDockNode *)0x0;
                pIVar7 = src_node;
              }
              *(ushort *)&pIVar7->field_0xbc =
                   (ushort)*(undefined4 *)&pIVar7->field_0xbc & 0xffc0 | 9;
              if ((pIVar7->Windows).Size < 1) {
                __assert_fail("i >= 0 && i < Size",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                              ,0x706,
                              "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
              }
              IVar11 = FixLargeWindowsWhenUndocking
                                 (&pIVar7->Size,
                                  &(*(pIVar7->Windows).Data)->Viewport->super_ImGuiViewport);
              pIVar7->Size = IVar11;
              pIVar7->field_0xbe = pIVar7->field_0xbe | 1;
              if (GImGui->SettingsDirtyTimer <= 0.0) {
                GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
              }
            }
          }
          else {
            DockContextProcessUndockWindow
                      ((ImGuiContext *)pIVar3[lVar9].UndockTargetWindow,(ImGuiWindow *)0x1,
                       (bool)((char)lVar9 * '@'));
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (ctx->DockContext).Requests.Size);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextNewFrameUpdateUndocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
    {
        if (dc->Nodes.Data.Size > 0 || dc->Requests.Size > 0)
            DockContextClearNodes(ctx, 0, true);
        return;
    }

    // Setting NoSplit at runtime merges all nodes
    if (g.IO.ConfigDockingNoSplit)
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (node->IsRootNode() && node->IsSplitNode())
                {
                    DockBuilderRemoveNodeChildNodes(node->ID);
                    //dc->WantFullRebuild = true;
                }

    // Process full rebuild
#if 0
    if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_C)))
        dc->WantFullRebuild = true;
#endif
    if (dc->WantFullRebuild)
    {
        DockContextRebuildNodes(ctx);
        dc->WantFullRebuild = false;
    }

    // Process Undocking requests (we need to process them _before_ the UpdateMouseMovingWindowNewFrame call in NewFrame)
    for (int n = 0; n < dc->Requests.Size; n++)
    {
        ImGuiDockRequest* req = &dc->Requests[n];
        if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetWindow)
            DockContextProcessUndockWindow(ctx, req->UndockTargetWindow);
        else if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetNode)
            DockContextProcessUndockNode(ctx, req->UndockTargetNode);
    }
}